

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O2

void __thiscall TTD::RuntimeContextInfo::RuntimeContextInfo(RuntimeContextInfo *this)

{
  (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.
  super_DListNodeBase<Js::RecyclableObject_*>.next.base =
       (DListNodeBase<Js::RecyclableObject_*> *)this;
  (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.
  super_DListNodeBase<Js::RecyclableObject_*>.prev.base =
       (DListNodeBase<Js::RecyclableObject_*> *)this;
  (this->m_worklist).list.super_DListBase<Js::RecyclableObject_*,_RealCount>.super_RealCount.count =
       0;
  (this->m_worklist).list.allocator = &Memory::HeapAllocator::Instance;
  UtilSupport::TTAutoString::TTAutoString(&this->m_nullString);
  JsUtil::
  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_coreObjToPathMap,&Memory::HeapAllocator::Instance,0x404);
  JsUtil::
  BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_coreBodyToPathMap,&Memory::HeapAllocator::Instance,0x200);
  JsUtil::
  BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::BaseDictionary(&this->m_coreDbgScopeToPathMap,&Memory::HeapAllocator::Instance,0x200);
  (this->m_sortedObjectList).
  super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       &Memory::HeapAllocator::Instance;
  (this->m_sortedObjectList).
  super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01382a20;
  (this->m_sortedObjectList).
  super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>.buffer =
       (Type)0x0;
  (this->m_sortedObjectList).
  super_ReadOnlyList<Js::RecyclableObject_*,_Memory::HeapAllocator,_DefaultComparer>.count = 0;
  (this->m_sortedObjectList).length = 0;
  (this->m_sortedObjectList).increment = 0x404;
  (this->m_sortedFunctionBodyList).
  super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       &Memory::HeapAllocator::Instance;
  (this->m_sortedFunctionBodyList).
  super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_01382a78;
  (this->m_sortedFunctionBodyList).
  super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>.buffer = (Type)0x0;
  (this->m_sortedFunctionBodyList).
  super_ReadOnlyList<Js::FunctionBody_*,_Memory::HeapAllocator,_DefaultComparer>.count = 0;
  (this->m_sortedFunctionBodyList).length = 0;
  (this->m_sortedFunctionBodyList).increment = 0x200;
  (this->m_sortedDbgScopeList).
  super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>.alloc =
       &Memory::HeapAllocator::Instance;
  (this->m_sortedDbgScopeList).
  super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_01382ad0;
  (this->m_sortedDbgScopeList).
  super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>.buffer = (Type)0x0
  ;
  (this->m_sortedDbgScopeList).
  super_ReadOnlyList<Js::DebuggerScope_*,_Memory::HeapAllocator,_DefaultComparer>.count = 0;
  (this->m_sortedDbgScopeList).length = 0;
  (this->m_sortedDbgScopeList).increment = 0x200;
  return;
}

Assistant:

RuntimeContextInfo::RuntimeContextInfo()
        : m_worklist(&HeapAllocator::Instance), m_nullString(),
        m_coreObjToPathMap(&HeapAllocator::Instance, TTD_CORE_OBJECT_COUNT), m_coreBodyToPathMap(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT), m_coreDbgScopeToPathMap(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT),
        m_sortedObjectList(&HeapAllocator::Instance, TTD_CORE_OBJECT_COUNT), m_sortedFunctionBodyList(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT), m_sortedDbgScopeList(&HeapAllocator::Instance, TTD_CORE_FUNCTION_BODY_COUNT)
    {
        ;
    }